

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O3

int main(void)

{
  X::var = 7;
  X::print();
  Y::var = 9;
  Y::print();
  Z::var = 0xb;
  Z::print();
  return 0;
}

Assistant:

int main()
{
	X::var = 7;
	X::print();
	using namespace Y;
	var = 9;
	print();
	{
		using Z::var;
		using Z::print;
		var = 11;
		print();
	}
	return 0;
}